

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall
World::swap_map_connections
          (World *this,uint16_t map_id_1,uint16_t map_id_2,uint16_t map_id_3,uint16_t map_id_4)

{
  uint8_t value;
  uint8_t value_00;
  uint8_t value_01;
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  MapConnection *this_00;
  MapConnection *this_01;
  bool bVar4;
  uint8_t stored_extra_byte;
  uint8_t stored_pos_y;
  uint8_t stored_pos_x;
  uint16_t stored_map_id;
  bool right_order;
  MapConnection *conn_2;
  MapConnection *conn_1;
  uint16_t map_id_4_local;
  uint16_t map_id_3_local;
  uint16_t map_id_2_local;
  uint16_t map_id_1_local;
  World *this_local;
  
  this_00 = map_connection(this,map_id_1,map_id_2);
  this_01 = map_connection(this,map_id_3,map_id_4);
  uVar2 = MapConnection::map_id_1(this_00);
  bVar4 = uVar2 == map_id_1;
  uVar2 = MapConnection::map_id_1(this_01);
  if (uVar2 != map_id_3) {
    bVar4 = !bVar4;
  }
  uVar2 = MapConnection::map_id_1(this_00);
  value = MapConnection::pos_x_1(this_00);
  value_00 = MapConnection::pos_y_1(this_00);
  value_01 = MapConnection::extra_byte_1(this_00);
  if (bVar4) {
    uVar3 = MapConnection::map_id_1(this_01);
    MapConnection::map_id_1(this_00,uVar3);
    uVar1 = MapConnection::pos_x_1(this_01);
    MapConnection::pos_x_1(this_00,uVar1);
    uVar1 = MapConnection::pos_y_1(this_01);
    MapConnection::pos_y_1(this_00,uVar1);
    uVar1 = MapConnection::extra_byte_1(this_01);
    MapConnection::extra_byte_1(this_00,uVar1);
    MapConnection::map_id_1(this_01,uVar2);
    MapConnection::pos_x_1(this_01,value);
    MapConnection::pos_y_1(this_01,value_00);
    MapConnection::extra_byte_1(this_01,value_01);
  }
  else {
    uVar3 = MapConnection::map_id_2(this_01);
    MapConnection::map_id_1(this_00,uVar3);
    uVar1 = MapConnection::pos_x_2(this_01);
    MapConnection::pos_x_1(this_00,uVar1);
    uVar1 = MapConnection::pos_y_2(this_01);
    MapConnection::pos_y_1(this_00,uVar1);
    uVar1 = MapConnection::extra_byte_2(this_01);
    MapConnection::extra_byte_1(this_00,uVar1);
    MapConnection::map_id_2(this_01,uVar2);
    MapConnection::pos_x_2(this_01,value);
    MapConnection::pos_y_2(this_01,value_00);
    MapConnection::extra_byte_2(this_01,value_01);
  }
  return;
}

Assistant:

void World::swap_map_connections(uint16_t map_id_1, uint16_t map_id_2, uint16_t map_id_3, uint16_t map_id_4)
{
    MapConnection& conn_1 = map_connection(map_id_1, map_id_2);
    MapConnection& conn_2 = map_connection(map_id_3, map_id_4);

    bool right_order = true;
    if(conn_1.map_id_1() != map_id_1)
        right_order = !right_order;
    if(conn_2.map_id_1() != map_id_3)
        right_order = !right_order;
    
    uint16_t stored_map_id = conn_1.map_id_1();
    uint8_t stored_pos_x = conn_1.pos_x_1();
    uint8_t stored_pos_y = conn_1.pos_y_1();
    uint8_t stored_extra_byte = conn_1.extra_byte_1();

    if(right_order)
    {
        conn_1.map_id_1(conn_2.map_id_1());
        conn_1.pos_x_1(conn_2.pos_x_1()); 
        conn_1.pos_y_1(conn_2.pos_y_1());
        conn_1.extra_byte_1(conn_2.extra_byte_1());

        conn_2.map_id_1(stored_map_id);
        conn_2.pos_x_1(stored_pos_x); 
        conn_2.pos_y_1(stored_pos_y);
        conn_2.extra_byte_1(stored_extra_byte);
    }
    else
    {
        conn_1.map_id_1(conn_2.map_id_2());
        conn_1.pos_x_1(conn_2.pos_x_2()); 
        conn_1.pos_y_1(conn_2.pos_y_2());
        conn_1.extra_byte_1(conn_2.extra_byte_2());

        conn_2.map_id_2(stored_map_id);
        conn_2.pos_x_2(stored_pos_x); 
        conn_2.pos_y_2(stored_pos_y);
        conn_2.extra_byte_2(stored_extra_byte);
    }
}